

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_CreateTapScriptControlParityBit_Test::~TaprootUtil_CreateTapScriptControlParityBit_Test
          (TaprootUtil_CreateTapScriptControlParityBit_Test *this)

{
  TaprootUtil_CreateTapScriptControlParityBit_Test *this_local;
  
  ~TaprootUtil_CreateTapScriptControlParityBit_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControlParityBit) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  ScriptBuilder builder;
  builder.AppendData(schnorr_pubkey.GetData());
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  Script redeem_script = builder.Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57")
  };
  TaprootScriptTree tree(redeem_script);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, nullptr, &locking_script);

  Transaction tx1(2, 0);
  tx1.AddTxIn(
      Txid("fee03a31ddbe8f8af75f9ccea23d2d49c27538b1c183aa90c4e35529161a78df"),
      0, 0xffffffff);  // bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(amt1, locking_script);
  EXPECT_EQ("0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetSignatureHash(0, pkh_script1.GetData(),
        sighash_type, Amount(int64_t{2500000000}), WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  Transaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(Amount(int64_t{2499998000}), addr2.GetLockingScript());
  std::vector<TxOut> utxo_list(1);
  utxo_list[0] = TxOut(amt1, locking_script);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetSchnorrSignatureHash(0, sighash_type, utxo_list, &script_data);
  EXPECT_EQ("194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}